

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_event.hpp
# Opt level: O0

basic_string_view<char,_std::char_traits<char>_> __thiscall
jsoncons::basic_staj_event<char>::get<std::basic_string_view<char,std::char_traits<char>>>
          (basic_staj_event<char> *this)

{
  error_code ec_00;
  bool bVar1;
  undefined8 uVar2;
  error_code *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  error_code ec;
  basic_string_view<char,_std::char_traits<char>_> val;
  error_code *in_stack_ffffffffffffffd8;
  ser_error *in_stack_ffffffffffffffe0;
  
  std::error_code::error_code(in_RDI);
  bVar3 = get<std::basic_string_view<char,std::char_traits<char>>>
                    ((basic_staj_event<char> *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffd8);
  if (!bVar1) {
    return bVar3;
  }
  uVar2 = __cxa_allocate_exception(0x58);
  ec_00._M_cat = (error_category *)in_stack_ffffffffffffffe0;
  ec_00._0_8_ = in_stack_ffffffffffffffd8;
  ser_error::ser_error(in_stack_ffffffffffffffe0,ec_00);
  __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

T get() const
    {
        std::error_code ec;
        T val = get<T>(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec));
        }
        return val;
    }